

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.h
# Opt level: O1

Ray * __thiscall
pbrt::Interaction::SpawnRayTo(Ray *__return_storage_ptr__,Interaction *this,Point3f *p2)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  MediumHandle *pMVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Vector3f d;
  
  auVar6._0_4_ = (this->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                 x.low;
  auVar6._4_4_ = (this->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                 x.high;
  auVar6._8_4_ = (this->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                 y.low;
  auVar6._12_4_ =
       (this->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  uVar3 = (p2->super_Tuple3<pbrt::Point3,_float>).x;
  uVar4 = (p2->super_Tuple3<pbrt::Point3,_float>).y;
  auVar6 = vhaddps_avx(auVar6,auVar6);
  auVar7._8_4_ = 0xbf000000;
  auVar7._0_8_ = 0xbf000000bf000000;
  auVar7._12_4_ = 0xbf000000;
  auVar6 = vmulps_avx512vl(auVar6,auVar7);
  d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar3 + auVar6._0_4_;
  d.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar4 + auVar6._4_4_;
  d.super_Tuple3<pbrt::Vector3,_float>.z =
       ((this->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
       (this->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) *
       -0.5 + (p2->super_Tuple3<pbrt::Point3,_float>).z;
  pbrt::SpawnRay(__return_storage_ptr__,
                 (Point3fi)
                 (this->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>,
                 (Normal3f)(this->n).super_Tuple3<pbrt::Normal3,_float>,this->time,d);
  if (this->mediumInterface == (MediumInterface *)0x0) {
    pMVar5 = &this->medium;
  }
  else {
    fVar1 = (this->n).super_Tuple3<pbrt::Normal3,_float>.z;
    fVar2 = (__return_storage_ptr__->d).super_Tuple3<pbrt::Vector3,_float>.z;
    auVar7 = ZEXT416((uint)(fVar1 * fVar2));
    auVar6 = vfmadd132ss_fma(ZEXT416((uint)(this->n).super_Tuple3<pbrt::Normal3,_float>.y),auVar7,
                             ZEXT416((uint)(__return_storage_ptr__->d).
                                           super_Tuple3<pbrt::Vector3,_float>.y));
    auVar7 = vfmsub213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar1),auVar7);
    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ + auVar7._0_4_)),
                             ZEXT416((uint)(this->n).super_Tuple3<pbrt::Normal3,_float>.x),
                             ZEXT416((uint)(__return_storage_ptr__->d).
                                           super_Tuple3<pbrt::Vector3,_float>.x));
    pMVar5 = &this->mediumInterface->inside + (0.0 < auVar6._0_4_);
  }
  (__return_storage_ptr__->medium).
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (pMVar5->
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          ).bits;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    Ray SpawnRayTo(const Point3f &p2) const {
        Ray r = pbrt::SpawnRayTo(pi, n, time, p2);
        r.medium = GetMedium(r.d);
        return r;
    }